

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * __thiscall pbrt::LightHandle::Bounds(LightHandle *this)

{
  undefined8 in_RSI;
  LightBounds *in_RDI;
  anon_class_1_0_00000001 bounds;
  
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  ::DispatchCPU<pbrt::LightHandle::Bounds()const::__0>
            ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

LightBounds LightHandle::Bounds() const {
    auto bounds = [](auto ptr) { return ptr->Bounds(); };
    return DispatchCPU(bounds);
}